

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

void Bmc_CexCareBits2_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  int fCompl1;
  int fCompl0;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar2 = Gia_ObjIsConst0(pObj);
  if ((iVar2 == 0) && ((*(ulong *)pObj >> 0x3e & 1) == 0)) {
    *(ulong *)pObj = *(ulong *)pObj & 0xbfffffffffffffff | 0x4000000000000000;
    iVar2 = Gia_ObjIsCi(pObj);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsAnd(pObj);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                      ,0x211,"void Bmc_CexCareBits2_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar5 = Gia_ObjFanin0(pObj);
      uVar1 = *(ulong *)pGVar5;
      uVar3 = Gia_ObjFaninC0(pObj);
      uVar3 = (uint)(uVar1 >> 0x1e) & 1 ^ uVar3;
      pGVar5 = Gia_ObjFanin1(pObj);
      uVar1 = *(ulong *)pGVar5;
      uVar4 = Gia_ObjFaninC1(pObj);
      uVar4 = (uint)(uVar1 >> 0x1e) & 1 ^ uVar4;
      if ((*(ulong *)pObj >> 0x1e & 1) == 0) {
        if ((uVar3 != 0) && (uVar4 != 0)) {
          __assert_fail("fCompl0 == 0 || fCompl1 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                        ,0x21c,"void Bmc_CexCareBits2_rec(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (uVar3 == 0) {
          pGVar5 = Gia_ObjFanin0(pObj);
          Bmc_CexCareBits2_rec(p,pGVar5);
        }
        else if (uVar4 == 0) {
          pGVar5 = Gia_ObjFanin1(pObj);
          Bmc_CexCareBits2_rec(p,pGVar5);
        }
      }
      else {
        if ((uVar3 != 1) || (uVar4 != 1)) {
          __assert_fail("fCompl0 == 1 && fCompl1 == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcCexTools.c"
                        ,0x216,"void Bmc_CexCareBits2_rec(Gia_Man_t *, Gia_Obj_t *)");
        }
        pGVar5 = Gia_ObjFanin0(pObj);
        Bmc_CexCareBits2_rec(p,pGVar5);
        pGVar5 = Gia_ObjFanin1(pObj);
        Bmc_CexCareBits2_rec(p,pGVar5);
      }
    }
  }
  return;
}

Assistant:

void Bmc_CexCareBits2_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int fCompl0, fCompl1;
    if ( Gia_ObjIsConst0(pObj) )
        return;
    if ( pObj->fMark1 )
        return;
    pObj->fMark1 = 1;
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
    if ( pObj->fMark0 )
    {
        assert( fCompl0 == 1 && fCompl1 == 1 );
        Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(pObj) );
        Bmc_CexCareBits2_rec( p, Gia_ObjFanin1(pObj) );
    }
    else
    {
        assert( fCompl0 == 0 || fCompl1 == 0 );
        if ( fCompl0 == 0 )
            Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(pObj) );
        /**/ 
        else 
        /**/ 
        if ( fCompl1 == 0 )
            Bmc_CexCareBits2_rec( p, Gia_ObjFanin1(pObj) );
    }
}